

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawInstancedTests.cpp
# Opt level: O1

void __thiscall vkt::Draw::InstancedTests::InstancedTests(InstancedTests *this,TestContext *testCtx)

{
  uint uVar1;
  TestContext *testCtx_00;
  TestNode *node;
  string testName;
  ostringstream string;
  long *local_508;
  long local_500;
  long local_4f8 [2];
  long local_4e8;
  ulong local_4e0;
  ulong local_4d8;
  long local_4d0;
  string local_4c8;
  Enum<vk::VkPrimitiveTopology,_4UL> local_4a8;
  string local_498 [3];
  ios_base local_428 [264];
  long *local_320 [2];
  long local_310 [12];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  tcu::TestCaseGroup::TestCaseGroup
            (&this->super_TestCaseGroup,testCtx,"instanced","Instanced drawing tests");
  (this->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InstancedTests_00d609f8;
  local_4e8 = 0;
  do {
    local_4d8 = (ulong)InstancedTests::topologies[local_4e8];
    local_4e0 = local_4d8 << 0x20;
    local_4d0 = 0;
    do {
      uVar1 = *(uint *)((long)InstancedTests::functions + local_4d0);
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,&DAT_00b627a4 + *(int *)(&DAT_00b627a4 + (long)(int)uVar1 * 4)
                 ,*(long *)(&DAT_00b62bf8 + (long)(int)uVar1 * 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"_",1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
      local_4a8.m_getName = ::vk::getPrimitiveTopologyName;
      local_4a8.m_value = (VkPrimitiveTopology)local_4d8;
      tcu::Format::Enum<vk::VkPrimitiveTopology,_4UL>::toStream(&local_4a8,(ostream *)local_498);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
      std::ios_base::~ios_base(local_428);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,(char *)local_508,local_500);
      if (local_508 != local_4f8) {
        operator_delete(local_508,local_4f8[0] + 1);
      }
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_498[0]._M_dataplus._M_p,local_498[0]._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
        operator_delete(local_498[0]._M_dataplus._M_p,local_498[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      std::ios_base::~ios_base(local_2b0);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      node = (TestNode *)operator_new(0xb8);
      testCtx_00 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
      de::toLower(local_498,&local_4c8);
      local_320[0] = local_310;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_320,"Instanced drawing test","");
      tcu::TestCase::TestCase
                ((TestCase *)node,testCtx_00,local_498[0]._M_dataplus._M_p,(char *)local_320[0]);
      node->_vptr_TestNode = (_func_int **)&PTR__InstancedDrawCase_00d60a48;
      node[1]._vptr_TestNode = (_func_int **)(uVar1 | local_4e0);
      node[1].m_testCtx = (TestContext *)&node[1].m_name._M_string_length;
      node[1].m_name._M_dataplus._M_p = (pointer)0x0;
      *(undefined1 *)&node[1].m_name._M_string_length = 0;
      *(size_type **)((long)&node[1].m_name.field_2 + 8) = &node[1].m_description._M_string_length;
      node[1].m_description._M_dataplus._M_p = (pointer)0x0;
      *(undefined1 *)&node[1].m_description._M_string_length = 0;
      std::__cxx11::string::_M_replace((ulong)&node[1].m_testCtx,0,(char *)0x0,0xb6280b);
      std::__cxx11::string::_M_replace
                ((ulong)((long)&node[1].m_name.field_2 + 8),0,node[1].m_description._M_dataplus._M_p
                 ,0xb62a7d);
      tcu::TestNode::addChild((TestNode *)this,node);
      if (local_320[0] != local_310) {
        operator_delete(local_320[0],local_310[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
        operator_delete(local_498[0]._M_dataplus._M_p,local_498[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
      }
      local_4d0 = local_4d0 + 4;
    } while (local_4d0 != 0x10);
    local_4e8 = local_4e8 + 1;
  } while (local_4e8 != 6);
  return;
}

Assistant:

InstancedTests::InstancedTests(tcu::TestContext& testCtx)
	: TestCaseGroup	(testCtx, "instanced", "Instanced drawing tests")
{
	static const vk::VkPrimitiveTopology	topologies[]			=
	{
		vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST,
		vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST,
		vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,
		vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,
		vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,
		vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,
	};
	static const TestParams::DrawFunction	functions[]				=
	{
		TestParams::FUNCTION_DRAW,
		TestParams::FUNCTION_DRAW_INDEXED,
		TestParams::FUNCTION_DRAW_INDIRECT,
		TestParams::FUNCTION_DRAW_INDEXED_INDIRECT,
	};

	for (int topologyNdx = 0; topologyNdx < DE_LENGTH_OF_ARRAY(topologies); topologyNdx++)
	{
		for (int functionNdx = 0; functionNdx < DE_LENGTH_OF_ARRAY(functions); functionNdx++)
		{
			TestParams param;
			param.function = functions[functionNdx];
			param.topology = topologies[topologyNdx];

			std::string testName = de::toString(param);

			addChild(new InstancedDrawCase(m_testCtx, de::toLower(testName), "Instanced drawing test", param));
		}
	}
}